

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O1

void __thiscall iu_UtilTest_x_iutest_x_Find_Test::Body(iu_UtilTest_x_iutest_x_Find_Test *this)

{
  long lVar1;
  int iVar2;
  UnitTest *pUVar3;
  TestSuite *pTVar4;
  TestInfo *val;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  uint uVar6;
  ulong uVar7;
  AssertionResult iutest_ar;
  TestInfo *in_stack_fffffffffffffd18;
  char *in_stack_fffffffffffffd20;
  AssertionResult local_2d8;
  AssertionHelper local_2b0;
  undefined1 local_280 [592];
  
  pUVar3 = iutest::UnitTest::instance();
  uVar6 = (uint)((ulong)((long)(pUVar3->super_UnitTestImpl).m_testsuites.
                               super__Vector_base<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pUVar3->super_UnitTestImpl).m_testsuites.
                              super__Vector_base<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3);
  if (0 < (int)uVar6) {
    uVar7 = 0;
    do {
      pUVar3 = iutest::UnitTest::instance();
      pTVar4 = (pUVar3->super_UnitTestImpl).m_testsuites.
               super__Vector_base<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>._M_impl
               .super__Vector_impl_data._M_start[uVar7];
      iVar2 = strcmp((pTVar4->m_testsuite_name)._M_dataplus._M_p,"UtilTest");
      if (iVar2 == 0) goto LAB_001330cf;
      uVar7 = uVar7 + 1;
    } while ((uVar6 & 0x7fffffff) != uVar7);
  }
  pTVar4 = (TestSuite *)0x0;
LAB_001330cf:
  iutest::internal::NullHelper<false>::CompareNe<iutest::TestSuite>(&local_2d8,"(testsuite)",pTVar4)
  ;
  if (local_2d8.m_result == false) {
    memset((iu_global_format_stringstream *)local_280,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_280);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2b0,local_2d8.m_message._M_dataplus._M_p,
               (allocator<char> *)&stack0xfffffffffffffd27);
    local_2b0.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp";
    local_2b0.m_part_result.super_iuCodeMessage.m_line = 0x17;
    local_2b0.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_2b0,(Fixed *)local_280,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_2b0.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_2b0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_2b0.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_280);
    std::ios_base::~ios_base((ios_base *)(local_280 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8.m_message._M_dataplus._M_p != &local_2d8.m_message.field_2) {
    operator_delete(local_2d8.m_message._M_dataplus._M_p,
                    local_2d8.m_message.field_2._M_allocated_capacity + 1);
  }
  pUVar3 = iutest::UnitTest::instance();
  uVar6 = (uint)((ulong)((long)(pUVar3->super_UnitTestImpl).m_testsuites.
                               super__Vector_base<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pUVar3->super_UnitTestImpl).m_testsuites.
                              super__Vector_base<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3);
  if ((int)uVar6 < 1) {
    pTVar4 = (TestSuite *)0x0;
  }
  else {
    uVar7 = 0;
    do {
      pUVar3 = iutest::UnitTest::instance();
      pTVar4 = (pUVar3->super_UnitTestImpl).m_testsuites.
               super__Vector_base<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>._M_impl
               .super__Vector_impl_data._M_start[uVar7];
      iVar2 = strcmp((pTVar4->m_testsuite_name)._M_dataplus._M_p,"UtilTest");
      if (iVar2 == 0) goto LAB_001331fc;
      uVar7 = uVar7 + 1;
    } while ((uVar6 & 0x7fffffff) != uVar7);
    pTVar4 = (TestSuite *)0x0;
  }
LAB_001331fc:
  if (pTVar4 != (TestSuite *)0x0) {
    lVar1 = *(long *)&(pTVar4->m_testinfos).
                      super__Vector_base<iutest::TestInfo_*,_std::allocator<iutest::TestInfo_*>_>.
                      _M_impl.super__Vector_impl_data;
    uVar6 = (uint)((ulong)((long)*(pointer *)
                                  ((long)&(pTVar4->m_testinfos).
                                          super__Vector_base<iutest::TestInfo_*,_std::allocator<iutest::TestInfo_*>_>
                                          ._M_impl + 8) - lVar1) >> 3);
    if (0 < (int)uVar6) {
      uVar7 = 0;
      do {
        val = *(TestInfo **)(lVar1 + uVar7 * 8);
        iVar2 = strcmp((val->m_testname)._M_dataplus._M_p,"Find");
        if (iVar2 == 0) goto LAB_00133252;
        uVar7 = uVar7 + 1;
      } while ((uVar6 & 0x7fffffff) != uVar7);
      val = (TestInfo *)0x0;
      goto LAB_00133252;
    }
  }
  val = (TestInfo *)0x0;
LAB_00133252:
  paVar5 = &local_2d8.m_message.field_2;
  iutest::internal::NullHelper<false>::CompareNe<iutest::TestInfo>
            (&local_2d8,"(::iuutil::FindTestInfo(\"UtilTest\", \"Find\"))",val);
  if (local_2d8.m_result == false) {
    memset((iu_global_format_stringstream *)local_280,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_280);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2b0,local_2d8.m_message._M_dataplus._M_p,
               (allocator<char> *)&stack0xfffffffffffffd27);
    local_2b0.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp";
    local_2b0.m_part_result.super_iuCodeMessage.m_line = 0x18;
    local_2b0.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_2b0,(Fixed *)local_280,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_2b0.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_2b0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_2b0.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_280);
    std::ios_base::~ios_base((ios_base *)(local_280 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8.m_message._M_dataplus._M_p != paVar5) {
    operator_delete(local_2d8.m_message._M_dataplus._M_p,
                    local_2d8.m_message.field_2._M_allocated_capacity + 1);
  }
  pUVar3 = iutest::UnitTest::instance();
  uVar6 = (uint)((ulong)((long)(pUVar3->super_UnitTestImpl).m_testsuites.
                               super__Vector_base<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pUVar3->super_UnitTestImpl).m_testsuites.
                              super__Vector_base<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3);
  if (0 < (int)uVar6) {
    uVar7 = 0;
    do {
      pUVar3 = iutest::UnitTest::instance();
      iVar2 = strcmp(((pUVar3->super_UnitTestImpl).m_testsuites.
                      super__Vector_base<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar7]->m_testsuite_name)._M_dataplus
                     ._M_p,"UtilTestXXX");
      if (iVar2 == 0) break;
      uVar7 = uVar7 + 1;
    } while ((uVar6 & 0x7fffffff) != uVar7);
  }
  iutest::internal::NullHelper<false>::CompareEq<iutest::TestSuite>
            (in_stack_fffffffffffffd20,(TestSuite *)in_stack_fffffffffffffd18);
  if (local_2d8.m_result == false) {
    memset((iu_global_format_stringstream *)local_280,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_280);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2b0,local_2d8.m_message._M_dataplus._M_p,
               (allocator<char> *)&stack0xfffffffffffffd27);
    local_2b0.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp";
    local_2b0.m_part_result.super_iuCodeMessage.m_line = 0x1d;
    local_2b0.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_2b0,(Fixed *)local_280,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_2b0.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_2b0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_2b0.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_280);
    std::ios_base::~ios_base((ios_base *)(local_280 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8.m_message._M_dataplus._M_p != paVar5) {
    operator_delete(local_2d8.m_message._M_dataplus._M_p,
                    local_2d8.m_message.field_2._M_allocated_capacity + 1);
  }
  pUVar3 = iutest::UnitTest::instance();
  uVar6 = (uint)((ulong)((long)(pUVar3->super_UnitTestImpl).m_testsuites.
                               super__Vector_base<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pUVar3->super_UnitTestImpl).m_testsuites.
                              super__Vector_base<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3);
  if (0 < (int)uVar6) {
    uVar7 = 0;
    do {
      pUVar3 = iutest::UnitTest::instance();
      pTVar4 = (pUVar3->super_UnitTestImpl).m_testsuites.
               super__Vector_base<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>._M_impl
               .super__Vector_impl_data._M_start[uVar7];
      iVar2 = strcmp((pTVar4->m_testsuite_name)._M_dataplus._M_p,"UtilTest");
      if (iVar2 == 0) goto LAB_0013348f;
      uVar7 = uVar7 + 1;
    } while ((uVar6 & 0x7fffffff) != uVar7);
  }
  pTVar4 = (TestSuite *)0x0;
LAB_0013348f:
  if (pTVar4 != (TestSuite *)0x0) {
    lVar1 = *(long *)&(pTVar4->m_testinfos).
                      super__Vector_base<iutest::TestInfo_*,_std::allocator<iutest::TestInfo_*>_>.
                      _M_impl.super__Vector_impl_data;
    uVar6 = (uint)((ulong)((long)*(pointer *)
                                  ((long)&(pTVar4->m_testinfos).
                                          super__Vector_base<iutest::TestInfo_*,_std::allocator<iutest::TestInfo_*>_>
                                          ._M_impl + 8) - lVar1) >> 3);
    if (0 < (int)uVar6) {
      uVar7 = 0;
      do {
        iVar2 = strcmp((char *)**(undefined8 **)(lVar1 + uVar7 * 8),"FindXXX");
        if (iVar2 == 0) break;
        uVar7 = uVar7 + 1;
      } while ((uVar6 & 0x7fffffff) != uVar7);
    }
  }
  iutest::internal::NullHelper<false>::CompareEq<iutest::TestInfo>
            (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  if (local_2d8.m_result == false) {
    memset((iu_global_format_stringstream *)local_280,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_280);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2b0,local_2d8.m_message._M_dataplus._M_p,
               (allocator<char> *)&stack0xfffffffffffffd27);
    local_2b0.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp";
    local_2b0.m_part_result.super_iuCodeMessage.m_line = 0x22;
    local_2b0.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_2b0,(Fixed *)local_280,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_2b0.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_2b0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_2b0.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_280);
    std::ios_base::~ios_base((ios_base *)(local_280 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8.m_message._M_dataplus._M_p != &local_2d8.m_message.field_2) {
    operator_delete(local_2d8.m_message._M_dataplus._M_p,
                    local_2d8.m_message.field_2._M_allocated_capacity + 1);
  }
  pUVar3 = iutest::UnitTest::instance();
  uVar6 = (uint)((ulong)((long)(pUVar3->super_UnitTestImpl).m_testsuites.
                               super__Vector_base<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pUVar3->super_UnitTestImpl).m_testsuites.
                              super__Vector_base<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3);
  if (0 < (int)uVar6) {
    uVar7 = 0;
    do {
      pUVar3 = iutest::UnitTest::instance();
      pTVar4 = (pUVar3->super_UnitTestImpl).m_testsuites.
               super__Vector_base<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>._M_impl
               .super__Vector_impl_data._M_start[uVar7];
      iVar2 = strcmp((pTVar4->m_testsuite_name)._M_dataplus._M_p,"UtilTestXXX");
      if (iVar2 == 0) goto LAB_00133604;
      uVar7 = uVar7 + 1;
    } while ((uVar6 & 0x7fffffff) != uVar7);
  }
  pTVar4 = (TestSuite *)0x0;
LAB_00133604:
  if (pTVar4 != (TestSuite *)0x0) {
    lVar1 = *(long *)&(pTVar4->m_testinfos).
                      super__Vector_base<iutest::TestInfo_*,_std::allocator<iutest::TestInfo_*>_>.
                      _M_impl.super__Vector_impl_data;
    uVar6 = (uint)((ulong)((long)*(pointer *)
                                  ((long)&(pTVar4->m_testinfos).
                                          super__Vector_base<iutest::TestInfo_*,_std::allocator<iutest::TestInfo_*>_>
                                          ._M_impl + 8) - lVar1) >> 3);
    if (0 < (int)uVar6) {
      uVar7 = 0;
      do {
        iVar2 = strcmp((char *)**(undefined8 **)(lVar1 + uVar7 * 8),"Find");
        if (iVar2 == 0) break;
        uVar7 = uVar7 + 1;
      } while ((uVar6 & 0x7fffffff) != uVar7);
    }
  }
  iutest::internal::NullHelper<false>::CompareEq<iutest::TestInfo>
            (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  if (local_2d8.m_result == false) {
    memset((iu_global_format_stringstream *)local_280,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_280);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2b0,local_2d8.m_message._M_dataplus._M_p,
               (allocator<char> *)&stack0xfffffffffffffd27);
    local_2b0.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp";
    local_2b0.m_part_result.super_iuCodeMessage.m_line = 0x23;
    local_2b0.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_2b0,(Fixed *)local_280,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_2b0.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_2b0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_2b0.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_280);
    std::ios_base::~ios_base((ios_base *)(local_280 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8.m_message._M_dataplus._M_p != &local_2d8.m_message.field_2) {
    operator_delete(local_2d8.m_message._M_dataplus._M_p,
                    local_2d8.m_message.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

IUTEST_P(ParamTest, Test)
{
}